

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void glfwSwapInterval(int interval)

{
  void *pvVar1;
  _GLFWwindow *window;
  int interval_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (pvVar1 == (void *)0x0) {
      _glfwInputError(0x10002,
                      "Cannot set swap interval without a current OpenGL or OpenGL ES context");
    }
    else {
      (**(code **)((long)pvVar1 + 600))(interval);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSwapInterval(int interval)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT();

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot set swap interval without a current OpenGL or OpenGL ES context");
        return;
    }

    window->context.swapInterval(interval);
}